

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.h
# Opt level: O0

size_t duckdb_fsst_decompress
                 (duckdb_fsst_decoder_t *decoder,size_t lenIn,uchar *strIn,size_t size,uchar *output
                 )

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uchar *puVar7;
  unsigned_long uVar8;
  uchar *local_78;
  uchar *symbolPointer;
  size_t endWrite;
  size_t posWrite;
  unsigned_long firstEscapePos;
  uint escapeMask;
  uint nextBlock;
  size_t posIn;
  size_t posOut;
  size_t code;
  unsigned_long_long *symbol;
  uchar *strOut;
  uchar *len;
  uchar *output_local;
  size_t size_local;
  uchar *strIn_local;
  
  _escapeMask = (uchar *)0x0;
  firstEscapePos = 0;
  do {
    while( true ) {
      if (size < _escapeMask + 0x20 || lenIn < firstEscapePos + 4) {
        if (_escapeMask + 0x20 <= size) {
          if (firstEscapePos + 2 <= lenIn) {
            output[(long)_escapeMask] = strIn[firstEscapePos + 1];
            if (strIn[firstEscapePos] == 0xff) {
              _escapeMask = _escapeMask + 1;
              firstEscapePos = firstEscapePos + 2;
            }
            else {
              bVar2 = strIn[firstEscapePos];
              *(unsigned_long_long *)(output + (long)_escapeMask) = decoder->symbol[bVar2];
              puVar7 = _escapeMask + decoder->len[bVar2];
              if (strIn[firstEscapePos + 1] == 0xff) {
                _escapeMask = puVar7 + 1;
                output[(long)puVar7] = strIn[firstEscapePos + 2];
                firstEscapePos = firstEscapePos + 3;
              }
              else {
                bVar2 = strIn[firstEscapePos + 1];
                *(unsigned_long_long *)(output + (long)puVar7) = decoder->symbol[bVar2];
                _escapeMask = puVar7 + decoder->len[bVar2];
                firstEscapePos = firstEscapePos + 2;
              }
            }
          }
          if (firstEscapePos < lenIn) {
            bVar2 = strIn[firstEscapePos];
            *(unsigned_long_long *)(output + (long)_escapeMask) = decoder->symbol[bVar2];
            firstEscapePos = firstEscapePos + 1;
            _escapeMask = _escapeMask + decoder->len[bVar2];
          }
        }
        while (firstEscapePos < lenIn) {
          uVar8 = firstEscapePos + 1;
          uVar6 = (ulong)strIn[firstEscapePos];
          if (uVar6 < 0xff) {
            symbolPointer = _escapeMask;
            puVar7 = _escapeMask + decoder->len[uVar6];
            lVar4 = (uVar6 * 8 + 0x108) - (long)_escapeMask;
            local_78 = puVar7;
            if (size < puVar7) {
              local_78 = (uchar *)size;
            }
            for (; firstEscapePos = uVar8, _escapeMask = puVar7, symbolPointer < local_78;
                symbolPointer = symbolPointer + 1) {
              output[(long)symbolPointer] = symbolPointer[(long)decoder + lVar4];
            }
          }
          else {
            if (_escapeMask < size) {
              output[(long)_escapeMask] = strIn[uVar8];
            }
            firstEscapePos = firstEscapePos + 2;
            _escapeMask = _escapeMask + 1;
          }
        }
        if ((size <= _escapeMask) && ((decoder->zeroTerminated & 1) != 0)) {
          output[size - 1] = '\0';
        }
        return (size_t)_escapeMask;
      }
      uVar5 = *(uint *)(strIn + firstEscapePos) & 0x80808080 &
              (((*(uint *)(strIn + firstEscapePos) ^ 0xffffffff) & 0x7f7f7f7f) + 0x7f7f7f7f ^
              0x80808080);
      if (uVar5 != 0) break;
      bVar2 = strIn[firstEscapePos];
      *(unsigned_long_long *)(output + (long)_escapeMask) = decoder->symbol[bVar2];
      _escapeMask = _escapeMask + decoder->len[bVar2];
      bVar2 = strIn[firstEscapePos + 1];
      *(unsigned_long_long *)(output + (long)_escapeMask) = decoder->symbol[bVar2];
      _escapeMask = _escapeMask + decoder->len[bVar2];
      bVar2 = strIn[firstEscapePos + 2];
      *(unsigned_long_long *)(output + (long)_escapeMask) = decoder->symbol[bVar2];
      bVar2 = decoder->len[bVar2];
      bVar1 = strIn[firstEscapePos + 3];
      *(unsigned_long_long *)(output + (long)(_escapeMask + bVar2)) = decoder->symbol[bVar1];
      firstEscapePos = firstEscapePos + 4;
      _escapeMask = _escapeMask + bVar2 + decoder->len[bVar1];
    }
    uVar3 = 0;
    for (uVar6 = (ulong)uVar5; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
      uVar3 = uVar3 + 1;
    }
    switch(uVar3 >> 3) {
    case 3:
      bVar2 = strIn[firstEscapePos];
      *(unsigned_long_long *)(output + (long)_escapeMask) = decoder->symbol[bVar2];
      _escapeMask = _escapeMask + decoder->len[bVar2];
      firstEscapePos = firstEscapePos + 1;
    case 2:
      bVar2 = strIn[firstEscapePos];
      *(unsigned_long_long *)(output + (long)_escapeMask) = decoder->symbol[bVar2];
      _escapeMask = _escapeMask + decoder->len[bVar2];
      firstEscapePos = firstEscapePos + 1;
    case 1:
      bVar2 = strIn[firstEscapePos];
      *(unsigned_long_long *)(output + (long)_escapeMask) = decoder->symbol[bVar2];
      _escapeMask = _escapeMask + decoder->len[bVar2];
      firstEscapePos = firstEscapePos + 1;
    case 0:
      output[(long)_escapeMask] = strIn[firstEscapePos + 1];
      firstEscapePos = firstEscapePos + 2;
      _escapeMask = _escapeMask + 1;
    }
  } while( true );
}

Assistant:

inline size_t /* OUT: bytesize of the decompressed string. If > size, the decoded output is truncated to size. */
duckdb_fsst_decompress(
   duckdb_fsst_decoder_t *decoder,  /* IN: use this symbol table for compression. */
   size_t lenIn,             /* IN: byte-length of compressed string. */
   const unsigned char *strIn,     /* IN: compressed string. */
   size_t size,              /* IN: byte-length of output buffer. */
   unsigned char *output     /* OUT: memory buffer to put the decompressed string in. */
) {
   unsigned char*__restrict__ len = (unsigned char* __restrict__) decoder->len;
   unsigned char*__restrict__ strOut = (unsigned char* __restrict__) output;
   unsigned long long*__restrict__ symbol = (unsigned long long* __restrict__) decoder->symbol; 
   size_t code, posOut = 0, posIn = 0;
#ifndef FSST_MUST_ALIGN /* defining on platforms that require aligned memory access may help their performance */
#define FSST_UNALIGNED_STORE(dst,src) memcpy((void*) (dst), &(src), sizeof(unsigned long long))
#if defined(__BYTE_ORDER__) && defined(__ORDER_LITTLE_ENDIAN__) && (__BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__)
   while (posOut+32 <= size && posIn+4 <= lenIn) {
      unsigned int nextBlock, escapeMask;
      memcpy(&nextBlock, strIn+posIn, sizeof(unsigned int));
      escapeMask = (nextBlock&0x80808080u)&((((~nextBlock)&0x7F7F7F7Fu)+0x7F7F7F7Fu)^0x80808080u);
      if (escapeMask == 0) {
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
     } else { 
         unsigned long firstEscapePos=static_cast<unsigned long>(__builtin_ctzll((unsigned long long) escapeMask)>>3);
         switch(firstEscapePos) { /* Duff's device */
         case 3: code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
			 DUCKDB_FSST_EXPLICIT_FALLTHROUGH;
         case 2: code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
			 DUCKDB_FSST_EXPLICIT_FALLTHROUGH;
         case 1: code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
			 DUCKDB_FSST_EXPLICIT_FALLTHROUGH;
         case 0: posIn+=2; strOut[posOut++] = strIn[posIn-1]; /* decompress an escaped byte */
         }
      }
   }
   if (posOut+32 <= size) { // handle the possibly 3 last bytes without a loop
      if (posIn+2 <= lenIn) { 
	 strOut[posOut] = strIn[posIn+1]; 
         if (strIn[posIn] != FSST_ESC) {
            code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
            if (strIn[posIn] != FSST_ESC) {
               code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
            } else { 
               posIn += 2; strOut[posOut++] = strIn[posIn-1]; 
            }
         } else {
            posIn += 2; posOut++; 
         } 
      }
      if (posIn < lenIn) { // last code cannot be an escape
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
      }
   }
#else
   while (posOut+8 <= size && posIn < lenIn)
      if ((code = strIn[posIn++]) < FSST_ESC) { /* symbol compressed as code? */
         FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); /* unaligned memory write */
         posOut += len[code];
      } else { 
         strOut[posOut] = strIn[posIn]; /* decompress an escaped byte */
         posIn++; posOut++; 
      }
#endif
#endif
   while (posIn < lenIn)
      if ((code = strIn[posIn++]) < FSST_ESC) {
         size_t posWrite = posOut, endWrite = posOut + len[code];
         unsigned char* __restrict__ symbolPointer = ((unsigned char* __restrict__) &symbol[code]) - posWrite;
         if ((posOut = endWrite) > size) endWrite = size;
         for(; posWrite < endWrite; posWrite++)  /* only write if there is room */
            strOut[posWrite] = symbolPointer[posWrite];
      } else {
         if (posOut < size) strOut[posOut] = strIn[posIn]; /* idem */
         posIn++; posOut++; 
      } 
   if (posOut >= size && (decoder->zeroTerminated&1)) strOut[size-1] = 0;
   return posOut; /* full size of decompressed string (could be >size, then the actually decompressed part) */
}